

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.hpp
# Opt level: O2

void __thiscall deqp::gls::ub::StructMember::~StructMember(StructMember *this)

{
  ub::VarType::~VarType(&this->m_type);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

StructMember	(const char* name, const VarType& type, deUint32 flags) : m_name(name), m_type(type), m_flags(flags) {}